

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall spvtools::opt::Function::Dump(Function *this)

{
  uint32_t uVar1;
  ostream *poVar2;
  Function *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Function #");
  uVar1 = result_id(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = opt::operator<<(poVar2,this);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void Function::Dump() const {
  std::cerr << "Function #" << result_id() << "\n" << *this << "\n";
}